

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compressBlock_btlazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *iLimit;
  undefined8 *puVar2;
  seqDef *psVar3;
  bool bVar4;
  undefined8 uVar5;
  seqStore_t *psVar6;
  U32 lowestValid;
  BYTE *pBVar7;
  ulong uVar8;
  ulong *puVar9;
  ulong *puVar10;
  ulong *puVar11;
  long lVar12;
  ulong *puVar13;
  int iVar14;
  BYTE *pBVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  BYTE *litEnd;
  BYTE *litEnd_1;
  BYTE *pBVar24;
  ulong *puVar25;
  size_t offbaseFound;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w;
  size_t local_a8;
  ZSTD_matchState_t *local_a0;
  uint local_94;
  ulong *local_90;
  seqStore_t *local_88;
  ulong *local_80;
  ulong *local_78;
  ulong *local_70;
  long local_68;
  ulong *local_60;
  uint local_54;
  uint local_50;
  uint local_4c;
  ulong local_48;
  uint *local_40;
  BYTE *local_38;
  
  iLimit = (ulong *)((long)src + srcSize);
  pBVar15 = (ms->window).base;
  uVar16 = (ms->window).dictLimit;
  local_38 = pBVar15 + uVar16;
  uVar21 = (ms->cParams).minMatch;
  uVar22 = 6;
  if (uVar21 < 6) {
    uVar22 = uVar21;
  }
  uVar21 = 4;
  if (4 < uVar22) {
    uVar21 = uVar22;
  }
  local_4c = *rep;
  puVar13 = (ulong *)((ulong)((int)src == (int)local_38) + (long)src);
  iVar14 = (int)puVar13 - (int)pBVar15;
  uVar22 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  local_50 = iVar14 - uVar22;
  if (iVar14 - uVar16 <= uVar22) {
    local_50 = uVar16;
  }
  if (ms->loadedDictEnd != 0) {
    local_50 = uVar16;
  }
  local_54 = rep[1];
  local_50 = iVar14 - local_50;
  uVar16 = local_54;
  if (local_50 < local_54) {
    uVar16 = 0;
  }
  uVar8 = (ulong)uVar16;
  uVar22 = local_4c;
  if (local_50 < local_4c) {
    uVar22 = 0;
  }
  uVar23 = (ulong)uVar22;
  local_80 = (ulong *)((long)src + (srcSize - 8));
  ms->lazySkipping = 0;
  local_40 = rep;
  if (puVar13 < local_80) {
    puVar9 = (ulong *)((long)iLimit + -7);
    local_70 = (ulong *)((long)iLimit + -3);
    local_78 = (ulong *)((long)iLimit + -1);
    local_60 = iLimit + -4;
    local_a0 = ms;
    local_90 = puVar9;
    local_88 = seqStore;
    do {
      local_94 = (uint)uVar8;
      uVar16 = (uint)uVar23;
      local_68 = -uVar23;
      if (uVar16 == 0) {
        pBVar15 = (BYTE *)0x0;
      }
      else {
        pBVar15 = (BYTE *)0x0;
        if (*(int *)(((long)puVar13 + 1) - uVar23) == *(int *)((long)puVar13 + 1)) {
          puVar1 = (ulong *)((long)puVar13 + 5);
          puVar10 = (ulong *)((long)puVar13 + local_68 + 5);
          puVar25 = puVar1;
          if (puVar1 < puVar9) {
            uVar23 = *puVar1 ^ *puVar10;
            uVar8 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
            pBVar15 = (BYTE *)(uVar8 >> 3 & 0x1fffffff);
            if (*puVar10 == *puVar1) {
              puVar25 = (ulong *)((long)puVar13 + 0xd);
              puVar10 = (ulong *)((long)puVar13 + local_68 + 0xd);
              do {
                if (puVar9 <= puVar25) goto LAB_00368964;
                uVar8 = *puVar10;
                uVar23 = *puVar25;
                uVar17 = uVar23 ^ uVar8;
                uVar20 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                  }
                }
                pBVar15 = (BYTE *)((long)puVar25 + ((uVar20 >> 3 & 0x1fffffff) - (long)puVar1));
                puVar25 = puVar25 + 1;
                puVar10 = puVar10 + 1;
              } while (uVar8 == uVar23);
            }
          }
          else {
LAB_00368964:
            if ((puVar25 < local_70) && ((int)*puVar10 == (int)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 4);
              puVar10 = (ulong *)((long)puVar10 + 4);
            }
            if ((puVar25 < local_78) && ((short)*puVar10 == (short)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 2);
              puVar10 = (ulong *)((long)puVar10 + 2);
            }
            if (puVar25 < iLimit) {
              puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar10 == (BYTE)*puVar25));
            }
            pBVar15 = (BYTE *)((long)puVar25 - (long)puVar1);
          }
          pBVar15 = pBVar15 + 4;
        }
      }
      local_a8 = 999999999;
      if (uVar21 == 6) {
        pBVar7 = (BYTE *)ZSTD_BtFindBestMatch_noDict_6
                                   (local_a0,(BYTE *)puVar13,(BYTE *)iLimit,&local_a8);
      }
      else if (uVar21 == 5) {
        pBVar7 = (BYTE *)ZSTD_BtFindBestMatch_noDict_5
                                   (local_a0,(BYTE *)puVar13,(BYTE *)iLimit,&local_a8);
      }
      else {
        pBVar7 = (BYTE *)ZSTD_BtFindBestMatch_noDict_4
                                   (local_a0,(BYTE *)puVar13,(BYTE *)iLimit,&local_a8);
      }
      pBVar24 = pBVar15;
      if (pBVar15 < pBVar7) {
        pBVar24 = pBVar7;
      }
      if (pBVar24 < (BYTE *)0x4) {
        uVar8 = (long)puVar13 - (long)src;
        puVar13 = (ulong *)((long)puVar13 + (uVar8 >> 8) + 1);
        local_a0->lazySkipping = (uint)(0x7ff < uVar8);
        uVar23 = (ulong)local_94;
        puVar9 = local_90;
LAB_00368a4f:
        uVar8 = uVar23;
        uVar23 = (ulong)uVar16;
      }
      else {
        puVar9 = puVar13;
        uVar20 = local_a8;
        if (pBVar7 <= pBVar15) {
          puVar9 = (ulong *)((long)puVar13 + 1);
          uVar20 = 1;
        }
        if (puVar13 < local_80) {
          do {
            puVar1 = (ulong *)((long)puVar13 + 1);
            if (((uVar20 != 0) && (uVar16 != 0)) &&
               (*(int *)puVar1 == *(int *)((long)puVar1 + local_68))) {
              puVar25 = (ulong *)((long)puVar13 + 5);
              puVar11 = (ulong *)((long)puVar13 + local_68 + 5);
              puVar10 = puVar25;
              if (puVar25 < local_90) {
                uVar23 = *puVar25 ^ *puVar11;
                uVar8 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                  }
                }
                pBVar15 = (BYTE *)(uVar8 >> 3 & 0x1fffffff);
                if (*puVar11 == *puVar25) {
                  puVar10 = (ulong *)((long)puVar13 + 0xd);
                  puVar11 = (ulong *)((long)puVar13 + local_68 + 0xd);
                  do {
                    if (local_90 <= puVar10) goto LAB_00368b2b;
                    uVar8 = *puVar11;
                    uVar23 = *puVar10;
                    uVar19 = uVar23 ^ uVar8;
                    uVar17 = 0;
                    if (uVar19 != 0) {
                      for (; (uVar19 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                      }
                    }
                    pBVar15 = (BYTE *)((long)puVar10 + ((uVar17 >> 3 & 0x1fffffff) - (long)puVar25))
                    ;
                    puVar10 = puVar10 + 1;
                    puVar11 = puVar11 + 1;
                  } while (uVar8 == uVar23);
                }
              }
              else {
LAB_00368b2b:
                if ((puVar10 < local_70) && ((int)*puVar11 == (int)*puVar10)) {
                  puVar10 = (ulong *)((long)puVar10 + 4);
                  puVar11 = (ulong *)((long)puVar11 + 4);
                }
                if ((puVar10 < local_78) && ((short)*puVar11 == (short)*puVar10)) {
                  puVar10 = (ulong *)((long)puVar10 + 2);
                  puVar11 = (ulong *)((long)puVar11 + 2);
                }
                if (puVar10 < iLimit) {
                  puVar10 = (ulong *)((long)puVar10 + (ulong)((BYTE)*puVar11 == (BYTE)*puVar10));
                }
                pBVar15 = (BYTE *)((long)puVar10 - (long)puVar25);
              }
              if (pBVar15 < (BYTE *)0xfffffffffffffffc) {
                uVar22 = 0x1f;
                if ((uint)uVar20 != 0) {
                  for (; (uint)uVar20 >> uVar22 == 0; uVar22 = uVar22 - 1) {
                  }
                }
                if ((int)((uVar22 ^ 0x1f) + (int)pBVar24 * 3 + -0x1e) < (int)(pBVar15 + 4) * 3) {
                  uVar20 = 1;
                  puVar9 = puVar1;
                  pBVar24 = pBVar15 + 4;
                }
              }
            }
            local_a8 = 999999999;
            if (uVar21 == 6) {
              pBVar15 = (BYTE *)ZSTD_BtFindBestMatch_noDict_6
                                          (local_a0,(BYTE *)puVar1,(BYTE *)iLimit,&local_a8);
            }
            else if (uVar21 == 5) {
              pBVar15 = (BYTE *)ZSTD_BtFindBestMatch_noDict_5
                                          (local_a0,(BYTE *)puVar1,(BYTE *)iLimit,&local_a8);
            }
            else {
              pBVar15 = (BYTE *)ZSTD_BtFindBestMatch_noDict_4
                                          (local_a0,(BYTE *)puVar1,(BYTE *)iLimit,&local_a8);
            }
            bVar4 = true;
            if ((BYTE *)0x3 < pBVar15) {
              uVar22 = 0x1f;
              if ((uint)uVar20 != 0) {
                for (; (uint)uVar20 >> uVar22 == 0; uVar22 = uVar22 - 1) {
                }
              }
              iVar14 = 0x1f;
              if ((uint)local_a8 != 0) {
                for (; (uint)local_a8 >> iVar14 == 0; iVar14 = iVar14 + -1) {
                }
              }
              if ((int)((uVar22 ^ 0x1f) + (int)pBVar24 * 4 + -0x1b) < (int)pBVar15 * 4 - iVar14) {
                bVar4 = false;
                uVar20 = local_a8;
                puVar9 = puVar1;
                pBVar24 = pBVar15;
              }
            }
            if (bVar4) {
              if (local_80 <= puVar1) break;
              puVar1 = (ulong *)((long)puVar13 + 2);
              if (((uVar20 != 0) && (uVar16 != 0)) &&
                 (*(int *)puVar1 == *(int *)((long)puVar1 + local_68))) {
                puVar25 = (ulong *)((long)puVar13 + 6);
                puVar11 = (ulong *)((long)puVar13 + local_68 + 6);
                puVar10 = puVar25;
                if (puVar25 < local_90) {
                  uVar23 = *puVar25 ^ *puVar11;
                  uVar8 = 0;
                  if (uVar23 != 0) {
                    for (; (uVar23 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                    }
                  }
                  pBVar15 = (BYTE *)(uVar8 >> 3 & 0x1fffffff);
                  if (*puVar11 == *puVar25) {
                    puVar10 = (ulong *)((long)puVar13 + 0xe);
                    puVar11 = (ulong *)((long)puVar13 + local_68 + 0xe);
                    do {
                      if (local_90 <= puVar10) goto LAB_00368d0a;
                      uVar8 = *puVar11;
                      uVar23 = *puVar10;
                      uVar19 = uVar23 ^ uVar8;
                      uVar17 = 0;
                      if (uVar19 != 0) {
                        for (; (uVar19 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                        }
                      }
                      pBVar15 = (BYTE *)((long)puVar10 +
                                        ((uVar17 >> 3 & 0x1fffffff) - (long)puVar25));
                      puVar10 = puVar10 + 1;
                      puVar11 = puVar11 + 1;
                    } while (uVar8 == uVar23);
                  }
                }
                else {
LAB_00368d0a:
                  if ((puVar10 < local_70) && ((int)*puVar11 == (int)*puVar10)) {
                    puVar10 = (ulong *)((long)puVar10 + 4);
                    puVar11 = (ulong *)((long)puVar11 + 4);
                  }
                  if ((puVar10 < local_78) && ((short)*puVar11 == (short)*puVar10)) {
                    puVar10 = (ulong *)((long)puVar10 + 2);
                    puVar11 = (ulong *)((long)puVar11 + 2);
                  }
                  if (puVar10 < iLimit) {
                    puVar10 = (ulong *)((long)puVar10 + (ulong)((BYTE)*puVar11 == (BYTE)*puVar10));
                  }
                  pBVar15 = (BYTE *)((long)puVar10 - (long)puVar25);
                }
                local_48 = uVar20;
                if (pBVar15 < (BYTE *)0xfffffffffffffffc) {
                  uVar22 = 0x1f;
                  if ((uint)uVar20 != 0) {
                    for (; (uint)uVar20 >> uVar22 == 0; uVar22 = uVar22 - 1) {
                    }
                  }
                  if ((int)((uVar22 ^ 0x1f) + (int)pBVar24 * 4 + -0x1e) < (int)(pBVar15 + 4) * 4) {
                    uVar20 = 1;
                    puVar9 = puVar1;
                    pBVar24 = pBVar15 + 4;
                  }
                }
              }
              local_a8 = 999999999;
              if (uVar21 == 6) {
                pBVar15 = (BYTE *)ZSTD_BtFindBestMatch_noDict_6
                                            (local_a0,(BYTE *)puVar1,(BYTE *)iLimit,&local_a8);
              }
              else if (uVar21 == 5) {
                pBVar15 = (BYTE *)ZSTD_BtFindBestMatch_noDict_5
                                            (local_a0,(BYTE *)puVar1,(BYTE *)iLimit,&local_a8);
              }
              else {
                pBVar15 = (BYTE *)ZSTD_BtFindBestMatch_noDict_4
                                            (local_a0,(BYTE *)puVar1,(BYTE *)iLimit,&local_a8);
              }
              bVar4 = true;
              if ((BYTE *)0x3 < pBVar15) {
                uVar22 = 0x1f;
                if ((uint)uVar20 != 0) {
                  for (; (uint)uVar20 >> uVar22 == 0; uVar22 = uVar22 - 1) {
                  }
                }
                iVar14 = 0x1f;
                if ((uint)local_a8 != 0) {
                  for (; (uint)local_a8 >> iVar14 == 0; iVar14 = iVar14 + -1) {
                  }
                }
                if ((int)((uVar22 ^ 0x1f) + (int)pBVar24 * 4 + -0x18) < (int)pBVar15 * 4 - iVar14) {
                  bVar4 = false;
                  uVar20 = local_a8;
                  puVar9 = puVar1;
                  pBVar24 = pBVar15;
                }
              }
              if (bVar4) break;
            }
            puVar13 = puVar1;
          } while (puVar13 < local_80);
        }
        uVar22 = local_94;
        if (3 < uVar20) {
          if ((src < puVar9) && (local_38 < (BYTE *)((long)puVar9 + (3 - uVar20)))) {
            puVar13 = puVar9;
            while (puVar9 = puVar13,
                  *(BYTE *)((long)puVar13 + -1) == *(BYTE *)((long)puVar13 + (2 - uVar20))) {
              puVar9 = (ulong *)((long)puVar13 + -1);
              pBVar24 = pBVar24 + 1;
              if ((puVar9 <= src) ||
                 (pBVar15 = (BYTE *)((long)puVar13 + (2 - uVar20)), puVar13 = puVar9,
                 pBVar15 <= local_38)) break;
            }
          }
          uVar22 = uVar16;
          uVar16 = (U32)uVar20 - 3;
        }
        uVar23 = (ulong)uVar16;
        uVar8 = (ulong)uVar22;
        uVar17 = (long)puVar9 - (long)src;
        if (local_60 < puVar9) {
          ZSTD_safecopyLiterals(local_88->lit,(BYTE *)src,(BYTE *)puVar9,(BYTE *)local_60);
        }
        else {
          puVar13 = (ulong *)local_88->lit;
          uVar19 = *(ulong *)((long)src + 8);
          *puVar13 = *src;
          puVar13[1] = uVar19;
          if (0x10 < uVar17) {
            pBVar15 = local_88->lit;
            uVar19 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar15 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar15 + 0x18) = uVar19;
            if (0x20 < (long)uVar17) {
              lVar12 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar12 + 0x20);
                uVar5 = puVar2[1];
                pBVar7 = pBVar15 + lVar12 + 0x20;
                *(undefined8 *)pBVar7 = *puVar2;
                *(undefined8 *)(pBVar7 + 8) = uVar5;
                puVar2 = (undefined8 *)((long)src + lVar12 + 0x30);
                uVar5 = puVar2[1];
                *(undefined8 *)(pBVar7 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar7 + 0x18) = uVar5;
                lVar12 = lVar12 + 0x20;
              } while (pBVar7 + 0x20 < pBVar15 + uVar17);
            }
          }
        }
        local_88->lit = local_88->lit + uVar17;
        if (0xffff < uVar17) {
          local_88->longLengthType = ZSTD_llt_literalLength;
          local_88->longLengthPos =
               (U32)((ulong)((long)local_88->sequences - (long)local_88->sequencesStart) >> 3);
        }
        psVar3 = local_88->sequences;
        psVar3->litLength = (U16)uVar17;
        psVar3->offBase = (U32)uVar20;
        if ((BYTE *)0xffff < pBVar24 + -3) {
          local_88->longLengthType = ZSTD_llt_matchLength;
          local_88->longLengthPos =
               (U32)((ulong)((long)psVar3 - (long)local_88->sequencesStart) >> 3);
        }
        psVar3->mlBase = (U16)(pBVar24 + -3);
        local_88->sequences = psVar3 + 1;
        if (local_a0->lazySkipping != 0) {
          local_a0->lazySkipping = 0;
        }
        puVar13 = (ulong *)((long)puVar9 + (long)pBVar24);
        puVar9 = local_90;
        src = puVar13;
        if ((uVar22 != 0) && (puVar13 <= local_80)) {
          do {
            uVar20 = uVar8;
            psVar6 = local_88;
            uVar16 = (uint)uVar20;
            uVar8 = uVar20;
            src = puVar13;
            if ((int)*puVar13 != *(int *)((long)puVar13 - uVar20)) break;
            puVar1 = (ulong *)((long)puVar13 + 4);
            puVar10 = (ulong *)((long)puVar13 + (4 - uVar20));
            puVar25 = puVar1;
            if (puVar1 < puVar9) {
              uVar17 = *puVar1 ^ *puVar10;
              uVar8 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                }
              }
              pBVar15 = (BYTE *)(uVar8 >> 3 & 0x1fffffff);
              if (*puVar10 == *puVar1) {
                puVar25 = (ulong *)((long)puVar13 + 0xc);
                puVar10 = (ulong *)((long)puVar13 + (0xc - uVar20));
                do {
                  if (puVar9 <= puVar25) goto LAB_0036908c;
                  uVar8 = *puVar10;
                  uVar17 = *puVar25;
                  uVar18 = uVar17 ^ uVar8;
                  uVar19 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  pBVar15 = (BYTE *)((long)puVar25 + ((uVar19 >> 3 & 0x1fffffff) - (long)puVar1));
                  puVar25 = puVar25 + 1;
                  puVar10 = puVar10 + 1;
                } while (uVar8 == uVar17);
              }
            }
            else {
LAB_0036908c:
              if ((puVar25 < local_70) && ((int)*puVar10 == (int)*puVar25)) {
                puVar25 = (ulong *)((long)puVar25 + 4);
                puVar10 = (ulong *)((long)puVar10 + 4);
              }
              if ((puVar25 < local_78) && ((short)*puVar10 == (short)*puVar25)) {
                puVar25 = (ulong *)((long)puVar25 + 2);
                puVar10 = (ulong *)((long)puVar10 + 2);
              }
              if (puVar25 < iLimit) {
                puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar10 == (BYTE)*puVar25));
              }
              pBVar15 = (BYTE *)((long)puVar25 - (long)puVar1);
            }
            puVar1 = (ulong *)local_88->lit;
            if (local_60 < puVar13) {
              ZSTD_safecopyLiterals((BYTE *)puVar1,(BYTE *)puVar13,(BYTE *)puVar13,(BYTE *)local_60)
              ;
              puVar9 = local_90;
            }
            else {
              uVar8 = puVar13[1];
              *puVar1 = *puVar13;
              puVar1[1] = uVar8;
            }
            psVar3 = psVar6->sequences;
            psVar3->litLength = 0;
            psVar3->offBase = 1;
            if ((BYTE *)0xffff < pBVar15 + 1) {
              psVar6->longLengthType = ZSTD_llt_matchLength;
              psVar6->longLengthPos =
                   (U32)((ulong)((long)psVar3 - (long)psVar6->sequencesStart) >> 3);
            }
            psVar3->mlBase = (U16)(pBVar15 + 1);
            psVar6->sequences = psVar3 + 1;
            puVar13 = (ulong *)((long)puVar13 + (long)(pBVar15 + 4));
            src = puVar13;
            if ((int)uVar23 == 0) goto LAB_00368a4f;
            uVar8 = uVar23;
            uVar23 = uVar20;
          } while (puVar13 <= local_80);
        }
      }
      uVar16 = (uint)uVar8;
      uVar22 = (uint)uVar23;
    } while (puVar13 < local_80);
  }
  if (local_54 <= local_50) {
    local_54 = 0;
  }
  uVar21 = local_54;
  if (uVar22 != 0) {
    uVar21 = local_4c;
  }
  if (local_4c <= local_50) {
    uVar21 = local_54;
    local_4c = 0;
  }
  if (uVar22 != 0) {
    local_4c = uVar22;
  }
  if (uVar16 != 0) {
    uVar21 = uVar16;
  }
  *local_40 = local_4c;
  local_40[1] = uVar21;
  return (long)iLimit - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_noDict);
}